

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O3

int __thiscall
arealights::LinearlyTransformedCosines::init(LinearlyTransformedCosines *this,EVP_PKEY_CTX *ctx)

{
  string *vertexShaderPath;
  undefined1 __p [8];
  int extraout_EAX;
  undefined1 local_68 [8];
  long *local_60;
  long local_50 [2];
  string local_40;
  
  vertexShaderPath =
       (string *)
       (this->_renderHelper).
       super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"../assets/LTC.vs.glsl","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"../assets/LTC.fs.glsl","");
  RenderHelper::makeSimpleShader((RenderHelper *)local_68,vertexShaderPath,&local_40);
  __p = local_68;
  local_68 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_ltcShader,(pointer)__p);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_68);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  loadLookupTextures(this);
  return extraout_EAX;
}

Assistant:

void LinearlyTransformedCosines::init()
{
    _ltcShader = _renderHelper->makeSimpleShader(
        "../assets/LTC.vs.glsl",
        "../assets/LTC.fs.glsl"
    );

    loadLookupTextures();
}